

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void * region_join(region *region,size_t size)

{
  slab_list *psVar1;
  small_stats *psVar2;
  rlist *prVar3;
  int iVar4;
  ulong uVar5;
  void *__dest;
  void *pvVar6;
  rlist *prVar7;
  size_t __n;
  
  if ((region->slabs).stats.used < size) {
    __assert_fail("size <= region_used(region)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                  ,0x71,"void *region_join(struct region *, size_t)");
  }
  if (region->reserved != 0) {
    __assert_fail("!region->reserved",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                  ,0x72,"void *region_join(struct region *, size_t)");
  }
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                  ,0x73,"void *region_join(struct region *, size_t)");
  }
  prVar7 = (region->slabs).slabs.next;
  uVar5 = (ulong)*(uint *)&prVar7[2].prev;
  if (size <= uVar5) {
    return (void *)((long)prVar7 + (uVar5 - size) + 0x28);
  }
  psVar1 = &region->slabs;
  if ((((slab_list *)prVar7 == psVar1) && (prVar7 == (psVar1->slabs).prev)) ||
     ((*(int *)&prVar7[1].prev - *(uint *)&prVar7[2].prev) - 0x38 < size)) {
    __dest = region_reserve_slow(region,size);
    if (__dest == (void *)0x0) {
      return (void *)0x0;
    }
  }
  else {
    __dest = (void *)((long)&prVar7[2].next + uVar5);
  }
  region->reserved = 1;
  __n = size;
  do {
    uVar5 = (ulong)*(uint *)&prVar7[2].prev;
    if (__n < uVar5) {
      memcpy(__dest,(void *)((long)prVar7 + (uVar5 - __n) + 0x28),__n);
      break;
    }
    memcpy((void *)((long)__dest + (__n - uVar5)),&prVar7[2].next,uVar5);
    prVar3 = prVar7 + 2;
    prVar7 = prVar7->next;
    __n = __n - *(uint *)&prVar3->prev;
  } while (__n != 0);
  region->reserved = 0;
  prVar7 = (region->slabs).slabs.next;
  if (((slab_list *)prVar7 != psVar1) || (prVar7 != (region->slabs).slabs.prev)) {
    iVar4 = *(int *)&prVar7[2].prev;
    uVar5 = (ulong)((*(int *)&prVar7[1].prev - iVar4) - 0x38);
    if (size <= uVar5) goto LAB_00105959;
  }
  pvVar6 = region_reserve_slow(region,size);
  if (pvVar6 == (void *)0x0) {
    return __dest;
  }
  prVar7 = (region->slabs).slabs.next;
  iVar4 = *(int *)&prVar7[2].prev;
  uVar5 = (ulong)((*(int *)&prVar7[1].prev - iVar4) - 0x38);
LAB_00105959:
  region->reserved = 1;
  if (size <= uVar5) {
    if (region->on_alloc_cb != (region_on_alloc_f)0x0) {
      (*region->on_alloc_cb)(region,size,region->cb_arg);
      iVar4 = *(int *)&prVar7[2].prev;
    }
    psVar2 = &(region->slabs).stats;
    psVar2->used = psVar2->used + size;
    *(int *)&prVar7[2].prev = (int)size + iVar4;
    region->reserved = 0;
    return __dest;
  }
  __assert_fail("size <= rslab_unused(slab)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                ,0xf8,"void *region_alloc(struct region *, size_t)");
}

Assistant:

void *
region_join(struct region *region, size_t size)
{
	assert(size <= region_used(region));
	assert(!region->reserved);
	assert(size > 0);
	struct rslab *slab = rlist_first_entry(&region->slabs.slabs,
					       struct rslab,
					       slab.next_in_list);

	if (slab->used >= size) {
		/* Don't move stuff if it's in a single chunk. */
		return (char *) rslab_data(slab) + slab->used - size;
	}
	/**
	 * Use region_reserve() to ensure slab->size is not
	 * changed when the joined region is in the same slab
	 * as the final chunk.
	 */
	char *ptr = region_reserve(region, size);
	size_t offset = size;
	if (ptr == NULL)
		return NULL;
	/*
	 * Copy data from last chunk to first, i.e. in the reverse order.
	 */
	while (offset > 0 && slab->used <= offset) {
		memcpy(ptr + offset - slab->used, rslab_data(slab), slab->used);
		offset -= slab->used;
		slab = rlist_next_entry(slab, slab.next_in_list);
	}
	if (offset > 0)
		memcpy(ptr, rslab_data(slab) + slab->used - offset, offset);
	region_alloc(region, size);
	return ptr;
}